

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cirs2obs.cpp
# Opt level: O3

void PrintResults(CEExecOptions *inputs,CESkyCoord *obs_coords,CESkyCoord *obs_cirs_coords,
                 CEAngle *hour_angle)

{
  double dVar1;
  CEAngle CStack_78;
  CEDate local_68;
  
  putchar(10);
  puts("******************************************");
  puts("* Results of CIRS -> Observed conversion *");
  puts("******************************************");
  puts("Observed Coordinates (output)");
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_68,dVar1,JD);
  (*obs_coords->_vptr_CESkyCoord[3])(&CStack_78,obs_coords,&local_68);
  CEAngle::Deg(&CStack_78);
  printf("    Azimuth        : %f degrees\n");
  CEAngle::~CEAngle(&CStack_78);
  CEDate::~CEDate(&local_68);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_68,dVar1,JD);
  (*obs_coords->_vptr_CESkyCoord[4])(&CStack_78,obs_coords,&local_68);
  CEAngle::Deg(&CStack_78);
  printf("    Zenith         : %+f degrees\n");
  CEAngle::~CEAngle(&CStack_78);
  CEDate::~CEDate(&local_68);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_68,dVar1,JD);
  (*obs_coords->_vptr_CESkyCoord[4])(&CStack_78,obs_coords,&local_68);
  dVar1 = CEAngle::Deg(&CStack_78);
  printf("    Altitude       : %+f degrees\n",90.0 - dVar1);
  CEAngle::~CEAngle(&CStack_78);
  CEDate::~CEDate(&local_68);
  puts("CIRS Coordinates (input)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"ra",(allocator *)&CStack_78);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_68);
  printf("    Right Ascension: %f degrees\n");
  std::__cxx11::string::~string((string *)&local_68);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"dec",(allocator *)&CStack_78);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_68);
  printf("    Declination    : %+f degrees\n");
  std::__cxx11::string::~string((string *)&local_68);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"juliandate",(allocator *)&CStack_78);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_68);
  printf("    Julian Date    : %f\n");
  std::__cxx11::string::~string((string *)&local_68);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_78);
  puts("Apparent CIRS Coordinates");
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_68,dVar1,JD);
  (*obs_cirs_coords->_vptr_CESkyCoord[3])(&CStack_78,obs_cirs_coords,&local_68);
  CEAngle::Deg(&CStack_78);
  printf("    Right Ascension: %f\n");
  CEAngle::~CEAngle(&CStack_78);
  CEDate::~CEDate(&local_68);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_68,dVar1,JD);
  (*obs_cirs_coords->_vptr_CESkyCoord[4])(&CStack_78,obs_cirs_coords,&local_68);
  CEAngle::Deg(&CStack_78);
  printf("    Declination    : %+f\n");
  CEAngle::~CEAngle(&CStack_78);
  CEDate::~CEDate(&local_68);
  CEAngle::Deg(hour_angle);
  printf("    Hour Angle     : %+f\n");
  puts("Observer Info");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"longitude",(allocator *)&CStack_78);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_68);
  printf("    Longitude      : %f deg\n");
  std::__cxx11::string::~string((string *)&local_68);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"latitude",(allocator *)&CStack_78);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_68);
  printf("    Latitude       : %+f deg\n");
  std::__cxx11::string::~string((string *)&local_68);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"elevation",(allocator *)&CStack_78);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_68);
  printf("    Elevation      : %f meters\n");
  std::__cxx11::string::~string((string *)&local_68);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"pressure",(allocator *)&CStack_78);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_68);
  printf("    Pressure       : %f hPa\n");
  std::__cxx11::string::~string((string *)&local_68);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"temperature",(allocator *)&CStack_78);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_68);
  printf("    Temperature    : %f Celsius\n");
  std::__cxx11::string::~string((string *)&local_68);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"humidity",(allocator *)&CStack_78);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_68);
  printf("    Relative Humid.: %f\n");
  std::__cxx11::string::~string((string *)&local_68);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_78);
  putchar(10);
  return;
}

Assistant:

void PrintResults(CEExecOptions&    inputs, 
                  const CESkyCoord& obs_coords,
                  const CESkyCoord& obs_cirs_coords,
                  const CEAngle&    hour_angle)
{
    std::printf("\n") ;
    std::printf("******************************************\n");
    std::printf("* Results of CIRS -> Observed conversion *\n");
    std::printf("******************************************\n");
    std::printf("Observed Coordinates (output)\n");
    std::printf("    Azimuth        : %f degrees\n", obs_coords.XCoord().Deg());
    std::printf("    Zenith         : %+f degrees\n", obs_coords.YCoord().Deg());
    std::printf("    Altitude       : %+f degrees\n", 90.0-obs_coords.YCoord().Deg());
    std::printf("CIRS Coordinates (input)\n");
    std::printf("    Right Ascension: %f degrees\n", inputs.AsDouble("ra"));
    std::printf("    Declination    : %+f degrees\n", inputs.AsDouble("dec"));
    std::printf("    Julian Date    : %f\n", inputs.AsDouble("juliandate"));
    std::printf("Apparent CIRS Coordinates\n");
    std::printf("    Right Ascension: %f\n", obs_cirs_coords.XCoord().Deg());
    std::printf("    Declination    : %+f\n", obs_cirs_coords.YCoord().Deg());
    std::printf("    Hour Angle     : %+f\n", hour_angle.Deg());
    std::printf("Observer Info\n");
    std::printf("    Longitude      : %f deg\n", inputs.AsDouble("longitude"));
    std::printf("    Latitude       : %+f deg\n", inputs.AsDouble("latitude"));
    std::printf("    Elevation      : %f meters\n", inputs.AsDouble("elevation"));
    std::printf("    Pressure       : %f hPa\n", inputs.AsDouble("pressure"));
    std::printf("    Temperature    : %f Celsius\n", inputs.AsDouble("temperature"));
    std::printf("    Relative Humid.: %f\n", inputs.AsDouble("humidity"));
    std::printf("\n");
}